

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

void __thiscall
HighsLpRelaxation::getCutPool
          (HighsLpRelaxation *this,HighsInt *num_col,HighsInt *num_cut,
          vector<double,_std::allocator<double>_> *cut_lower,
          vector<double,_std::allocator<double>_> *cut_upper,HighsSparseMatrix *cut_matrix)

{
  value_type vVar1;
  int iVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *in_RCX;
  int *in_RDX;
  int *in_RSI;
  undefined8 *in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  undefined4 *in_R9;
  HighsInt iCut_2;
  HighsInt iEl_1;
  HighsInt iCol_1;
  HighsInt length;
  HighsInt iCut_1;
  HighsInt num_cut_nz;
  HighsInt iCut;
  HighsInt iEl;
  HighsInt iCol;
  vector<int,_std::allocator<int>_> cut_matrix_length;
  HighsInt iRow;
  HighsInt cut_num;
  vector<int,_std::allocator<int>_> cut_row_index;
  HighsInt num_model_row;
  HighsInt num_lp_row;
  HighsLp lp;
  size_type in_stack_fffffffffffffb48;
  HighsLp *in_stack_fffffffffffffb50;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb60;
  size_type in_stack_fffffffffffffb68;
  value_type vVar6;
  undefined4 in_stack_fffffffffffffb70;
  value_type in_stack_fffffffffffffb74;
  int local_444;
  int local_440;
  undefined4 in_stack_fffffffffffffbc8;
  int iVar7;
  undefined4 in_stack_fffffffffffffbcc;
  int iVar8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  int local_428;
  vector<int,_std::allocator<int>_> local_420;
  int local_404;
  int local_400;
  undefined4 local_3fc;
  vector<int,_std::allocator<int>_> local_3f8;
  HighsInt local_3d0;
  int local_3cc;
  int local_3c8;
  int local_3c4;
  vector<double,_std::allocator<double>_> vStack_378;
  vector<double,_std::allocator<double>_> vStack_360;
  vector<int,_std::allocator<int>_> avStack_338 [2];
  vector<int,_std::allocator<int>_> vStack_308;
  vector<double,_std::allocator<double>_> avStack_2f0 [29];
  undefined4 *local_30;
  vector<double,_std::allocator<double>_> *local_28;
  vector<double,_std::allocator<double>_> *local_20;
  int *local_18;
  int *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Highs::getLp((Highs *)(in_RDI + 1));
  HighsLp::HighsLp((HighsLp *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (HighsLp *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  *local_10 = local_3c8;
  local_3cc = local_3c4;
  local_3d0 = HighsMipSolver::numRow((HighsMipSolver *)*in_RDI);
  *local_18 = local_3cc - local_3d0;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68
            );
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68
            );
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x60267a);
  local_3fc = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb48,(value_type_conflict2 *)0x60269f);
  local_400 = 0;
  for (local_404 = 0; local_404 < local_3c4; local_404 = local_404 + 1) {
    pvVar3 = std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::
             operator[]((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                         *)(in_RDI + 0xa39),(long)local_404);
    iVar8 = local_400;
    if (pvVar3->origin == kCutPool) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3f8,(long)local_404);
      *pvVar4 = iVar8;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&vStack_378,(long)local_404)
      ;
      vVar6 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_400);
      *pvVar5 = vVar6;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&vStack_360,(long)local_404)
      ;
      vVar6 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_400);
      *pvVar5 = vVar6;
      local_400 = local_400 + 1;
    }
  }
  local_30[1] = local_3c8;
  local_30[2] = *local_18;
  *local_30 = 2;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x602838);
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb48,(value_type_conflict2 *)0x602860);
  for (local_428 = 0; local_428 < local_3c8; local_428 = local_428 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](avStack_338,(long)local_428);
    vVar1 = *pvVar4;
    while (iVar8 = vVar1,
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (avStack_338,(long)(local_428 + 1)), vVar1 < *pvVar4) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_308,(long)iVar8);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3f8,(long)*pvVar4);
      if (-1 < *pvVar4) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_420,(long)*pvVar4);
        *pvVar4 = *pvVar4 + 1;
      }
      vVar1 = iVar8 + 1;
    }
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68
            );
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(local_30 + 4),0);
  *pvVar4 = 0;
  iVar8 = 0;
  for (iVar7 = 0; iVar7 < *local_18; iVar7 = iVar7 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_420,(long)iVar7);
    iVar2 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_30 + 4),(long)iVar7);
    in_stack_fffffffffffffb74 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_420,(long)iVar7);
    *pvVar4 = in_stack_fffffffffffffb74;
    iVar2 = iVar2 + iVar8;
    iVar8 = iVar2;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_30 + 4),(long)(iVar7 + 1));
    *pvVar4 = iVar2;
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68
            );
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68
            );
  for (local_440 = 0; local_440 < local_3c8; local_440 = local_440 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](avStack_338,(long)local_440);
    local_444 = *pvVar4;
    while (iVar8 = local_444,
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (avStack_338,(long)(local_440 + 1)), iVar8 < *pvVar4) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_308,(long)local_444);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3f8,(long)*pvVar4);
      iVar8 = *pvVar4;
      if (-1 < iVar8) {
        in_stack_fffffffffffffb50 = (HighsLp *)(local_30 + 0x10);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_420,(long)iVar8);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb50,
                            (long)*pvVar4);
        *pvVar4 = local_440;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (avStack_2f0,(long)local_444);
        vVar6 = *pvVar5;
        in_stack_fffffffffffffb60 = (vector<double,_std::allocator<double>_> *)(local_30 + 0x16);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_420,(long)iVar8);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_fffffffffffffb60,(long)*pvVar4);
        *pvVar5 = vVar6;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_420,(long)iVar8);
        *pvVar4 = *pvVar4 + 1;
      }
      local_444 = local_444 + 1;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb60);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb60);
  HighsLp::~HighsLp(in_stack_fffffffffffffb50);
  return;
}

Assistant:

void HighsLpRelaxation::getCutPool(HighsInt& num_col, HighsInt& num_cut,
                                   std::vector<double>& cut_lower,
                                   std::vector<double>& cut_upper,
                                   HighsSparseMatrix& cut_matrix) const {
  // NB RESTORE reference
  //  const HighsLp& lp = lpsolver.getLp();
  HighsLp lp = lpsolver.getLp();
  num_col = lp.num_col_;
  HighsInt num_lp_row = lp.num_row_;
  HighsInt num_model_row = mipsolver.numRow();
  num_cut = num_lp_row - num_model_row;
  cut_lower.resize(num_cut);
  cut_upper.resize(num_cut);
  // Get a map from row index to cut row index
  std::vector<HighsInt> cut_row_index;
  cut_row_index.assign(num_lp_row, -1);
  HighsInt cut_num = 0;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (lprows[iRow].origin != LpRow::Origin::kCutPool) continue;
    cut_row_index[iRow] = cut_num;
    cut_lower[cut_num] = lp.row_lower_[iRow];
    cut_upper[cut_num] = lp.row_upper_[iRow];
    cut_num++;
  }
  assert(cut_num == num_cut);

  cut_matrix.num_col_ = lp.num_col_;
  cut_matrix.num_row_ = num_cut;
  cut_matrix.format_ = MatrixFormat::kRowwise;

  std::vector<HighsInt> cut_matrix_length;
  cut_matrix_length.assign(num_cut, 0);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    for (HighsInt iEl = lp.a_matrix_.start_[iCol];
         iEl < lp.a_matrix_.start_[iCol + 1]; iEl++) {
      HighsInt iCut = cut_row_index[lp.a_matrix_.index_[iEl]];
      if (iCut >= 0) cut_matrix_length[iCut]++;
    }
  }
  cut_matrix.start_.resize(num_cut + 1);
  cut_matrix.start_[0] = 0;
  HighsInt num_cut_nz = 0;
  for (HighsInt iCut = 0; iCut < num_cut; iCut++) {
    HighsInt length = cut_matrix_length[iCut];
    cut_matrix_length[iCut] = cut_matrix.start_[iCut];
    num_cut_nz += length;
    cut_matrix.start_[iCut + 1] = num_cut_nz;
  }
  cut_matrix.index_.resize(num_cut_nz);
  cut_matrix.value_.resize(num_cut_nz);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    for (HighsInt iEl = lp.a_matrix_.start_[iCol];
         iEl < lp.a_matrix_.start_[iCol + 1]; iEl++) {
      HighsInt iCut = cut_row_index[lp.a_matrix_.index_[iEl]];
      if (iCut >= 0) {
        cut_matrix.index_[cut_matrix_length[iCut]] = iCol;
        cut_matrix.value_[cut_matrix_length[iCut]] = lp.a_matrix_.value_[iEl];
        cut_matrix_length[iCut]++;
      }
    }
  }
}